

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O1

route_id __thiscall helics::CoreBroker::getRoute(CoreBroker *this,GlobalFederateId fedid)

{
  ulong uVar1;
  BaseType BVar2;
  _Hash_node_base *p_Var3;
  BaseType *pBVar4;
  ulong uVar5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  
  BVar2 = 0;
  if ((fedid.gid != 0) && (BVar2 = 0, (this->super_BrokerBase).higher_broker_id.gid != fedid.gid)) {
    uVar1 = (this->routing_table)._M_h._M_bucket_count;
    uVar5 = (ulong)(long)fedid.gid % uVar1;
    p_Var6 = (this->routing_table)._M_h._M_buckets[uVar5];
    p_Var7 = (__node_base_ptr)0x0;
    if ((p_Var6 != (__node_base_ptr)0x0) &&
       (p_Var3 = p_Var6->_M_nxt, p_Var7 = p_Var6, *(int *)&p_Var6->_M_nxt[1]._M_nxt != fedid.gid)) {
      while (p_Var6 = p_Var3, p_Var3 = p_Var6->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
        p_Var7 = (__node_base_ptr)0x0;
        if (((ulong)(long)*(int *)&p_Var3[1]._M_nxt % uVar1 != uVar5) ||
           (p_Var7 = p_Var6, *(int *)&p_Var3[1]._M_nxt == fedid.gid)) goto LAB_00347d66;
      }
      p_Var7 = (__node_base_ptr)0x0;
    }
LAB_00347d66:
    if (p_Var7 == (__node_base_ptr)0x0) {
      p_Var3 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var3 = p_Var7->_M_nxt;
    }
    pBVar4 = &parent_route_id;
    if (p_Var3 != (_Hash_node_base *)0x0) {
      pBVar4 = (BaseType *)((long)&p_Var3[1]._M_nxt + 4);
    }
    BVar2 = *pBVar4;
  }
  return (route_id)BVar2;
}

Assistant:

route_id CoreBroker::getRoute(GlobalFederateId fedid) const
{
    if ((fedid == parent_broker_id) || (fedid == higher_broker_id)) {
        return parent_route_id;
    }
    auto fnd = routing_table.find(fedid);
    return (fnd != routing_table.end()) ? fnd->second :
                                          parent_route_id;  // zero is the default route
}